

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O2

type CLI::detail::checked_multiply<int>(int *a,int b)

{
  type_conflict tVar1;
  int local_c;
  
  local_c = *a;
  if ((b == 0 || local_c == 0) || (b == 1 || local_c == 1)) {
    local_c = local_c * b;
  }
  else {
    local_c = b;
    tVar1 = overflowCheck<int>(a,&local_c);
    if (tVar1 != 0) {
      return false;
    }
    local_c = *a * local_c;
  }
  *a = local_c;
  return true;
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, bool>::type checked_multiply(T &a, T b) {
    if(a == 0 || b == 0 || a == 1 || b == 1) {
        a *= b;
        return true;
    }
    if(a == (std::numeric_limits<T>::min)() || b == (std::numeric_limits<T>::min)()) {
        return false;
    }
    if(overflowCheck(a, b)) {
        return false;
    }
    a *= b;
    return true;
}